

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O0

int kvtree_pack_uint32_t(void *buf,size_t buf_size,size_t *buf_pos,uint32_t val)

{
  size_t sVar1;
  __uint32_t _Var2;
  ulong uVar3;
  uint32_t val_network;
  size_t pos_final;
  size_t pos;
  uint32_t val_local;
  size_t *buf_pos_local;
  size_t buf_size_local;
  void *buf_local;
  
  if ((buf == (void *)0x0) || (buf_pos == (size_t *)0x0)) {
    kvtree_err("NULL pointer to buffer or buffer position @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
               ,0x8b);
    buf_local._4_4_ = 1;
  }
  else {
    sVar1 = *buf_pos;
    uVar3 = sVar1 + 4;
    if (buf_size < uVar3) {
      kvtree_err("Attempting to pack too many bytes into buffer @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
                 ,0x99);
      buf_local._4_4_ = 1;
    }
    else {
      _Var2 = __bswap_32(val);
      *(__uint32_t *)((long)buf + sVar1) = _Var2;
      *buf_pos = uVar3;
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int kvtree_pack_uint32_t(void* buf, size_t buf_size, size_t* buf_pos, uint32_t val)
{
  /* check that we have a valid pointer to a buffer position value */
  if (buf == NULL || buf_pos == NULL) {
    kvtree_err("NULL pointer to buffer or buffer position @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get current buffer position */
  size_t pos = *buf_pos;

  /* compute final buffer position */
  size_t pos_final = pos + sizeof(val);

  /* check that we won't overrun the buffer */
  if (pos_final > buf_size) {
    kvtree_err("Attempting to pack too many bytes into buffer @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* convert value to network order */
  uint32_t val_network = kvtree_hton32(val);

  /* pack value into buffer */
  memcpy(buf + pos, &val_network, sizeof(val_network));

  /* update position */
  *buf_pos = pos_final;

  return KVTREE_SUCCESS;
}